

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O2

Vec_Ptr_t * getVecOfVecFairness(FILE *fp)

{
  Vec_Ptr_t *pVVar1;
  char *pcVar2;
  char stringBuffer [100];
  
  pVVar1 = Vec_PtrAlloc((int)fp);
  do {
    pcVar2 = fgets(stringBuffer,0x32,(FILE *)fp);
  } while (pcVar2 != (char *)0x0);
  return pVVar1;
}

Assistant:

Vec_Ptr_t *getVecOfVecFairness(FILE *fp)
{
	Vec_Ptr_t *masterVector = Vec_PtrAlloc(0);
	//Vec_Ptr_t *currSignalVector;
	char stringBuffer[100];
	//int i;
	
	while(fgets(stringBuffer, 50, fp))
	{
		if(strstr(stringBuffer, ":"))
		{

		}
		else
		{
				
		}
	}

	return masterVector;
}